

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stat.h
# Opt level: O3

ostream * operator<<(ostream *out,Stat<int> *stat)

{
  long lVar1;
  ostream *poVar2;
  double dVar3;
  
  lVar1 = *(long *)out;
  *(uint *)(out + *(long *)(lVar1 + -0x18) + 0x18) =
       *(uint *)(out + *(long *)(lVar1 + -0x18) + 0x18) & 0xfffffefb | 4;
  *(undefined8 *)(out + *(long *)(lVar1 + -0x18) + 8) = 4;
  poVar2 = out + *(long *)(lVar1 + -0x18);
  if (out[*(long *)(lVar1 + -0x18) + 0xe1] == (ostream)0x0) {
    std::ios::widen((char)poVar2);
    poVar2[0xe1] = (ostream)0x1;
    lVar1 = *(long *)out;
  }
  poVar2[0xe0] = (ostream)0x20;
  *(undefined8 *)(out + *(long *)(lVar1 + -0x18) + 0x10) = 7;
  std::__ostream_insert<char,std::char_traits<char>>(out,"range: [",8);
  *(undefined8 *)(out + *(long *)(*(long *)out + -0x18) + 0x10) = 7;
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)out,stat->minValue);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
  std::ostream::operator<<((ostream *)poVar2,stat->maxValue);
  std::__ostream_insert<char,std::char_traits<char>>(out,"], mean: ",9);
  dVar3 = 0.0;
  if (stat->cnt != 0) {
    dVar3 = (double)((float)stat->sum / (float)stat->cnt);
  }
  poVar2 = std::ostream::_M_insert<double>(dVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,", cnt: ",7);
  std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::__ostream_insert<char,std::char_traits<char>>(out,", sumOfSquares: ",0x10);
  dVar3 = 0.0;
  if (stat->cnt != 0) {
    dVar3 = (double)((float)stat->sumOfSquares / (float)stat->cnt);
  }
  std::ostream::_M_insert<double>(dVar3);
  std::__ostream_insert<char,std::char_traits<char>>(out,", ref: ",7);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)out,stat->ref);
  return poVar2;
}

Assistant:

std::ostream &operator<<( std::ostream &out, const Stat<M> &stat )
{
    int defPrecision = 4;
    int defWidth = defPrecision + 3;
    out << std::fixed << std::setprecision( defPrecision ) << std::setfill( ' ' ) << std::setw( defWidth );
    out << "range: [" << std::setw( defWidth ) << stat.GetMin() << " " << stat.GetMax();
    out << "], mean: " << stat.GetMean() << ", cnt: " << stat.GetCnt();
    out << ", sumOfSquares: " << stat.GetMeanSquare();
    return out << ", ref: " << stat.GetRef();
}